

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPC07OPT_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double lapl_a;
  double lapl_b;
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double rho_a;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double vlb;
  double vla;
  double local_60;
  double local_58;
  long local_50;
  const_host_buffer_type local_48;
  const_host_buffer_type local_40;
  const_host_buffer_type local_38;
  
  if (0 < N) {
    lVar2 = (ulong)(uint)N << 4;
    lVar3 = 0;
    lVar4 = 0;
    local_50 = lVar2;
    local_48 = rho;
    local_40 = lapl;
    local_38 = tau;
    do {
      lapl_a = *(double *)((long)lapl + lVar3);
      lapl_b = *(double *)((long)lapl + lVar3 + 8);
      dVar6 = *(double *)((long)rho + lVar3);
      dVar7 = *(double *)((long)rho + lVar3 + 8);
      dVar8 = *(double *)((long)sigma + lVar4);
      dVar1 = *(double *)((long)sigma + lVar4 + 8);
      dVar9 = *(double *)((long)sigma + lVar4 + 0x10);
      dVar11 = *(double *)((long)tau + lVar3);
      dVar10 = *(double *)((long)tau + lVar3 + 8);
      *eps = 0.0;
      *(undefined8 *)((long)vrho + lVar3) = 0;
      ((undefined8 *)((long)vrho + lVar3))[1] = 0;
      *(undefined8 *)((long)vsigma + lVar4 + 0x10) = 0;
      *(undefined8 *)((long)vsigma + lVar4) = 0;
      ((undefined8 *)((long)vsigma + lVar4))[1] = 0;
      local_58 = 0.0;
      local_60 = 0.0;
      *(undefined8 *)((long)vtau + lVar3) = 0;
      ((undefined8 *)((long)vtau + lVar3))[1] = 0;
      if (1e-15 < dVar6 + dVar7) {
        rho_a = 1e-15;
        if (1e-15 <= dVar6) {
          rho_a = dVar6;
        }
        dVar6 = 1e-15;
        if (1e-15 <= dVar7) {
          dVar6 = dVar7;
        }
        dVar7 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar8) {
          dVar7 = dVar8;
        }
        dVar8 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar9) {
          dVar8 = dVar9;
        }
        dVar9 = 0.0;
        if (0.0 <= dVar11) {
          dVar9 = dVar11;
        }
        dVar11 = 0.0;
        if (0.0 <= dVar10) {
          dVar11 = dVar10;
        }
        dVar10 = (dVar7 + dVar8) * 0.5;
        uVar5 = -(ulong)(-dVar10 <= dVar1);
        dVar1 = (double)(uVar5 & (ulong)dVar1 | ~uVar5 & (ulong)-dVar10);
        uVar5 = -(ulong)(dVar1 <= dVar10);
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar_impl
                  (rho_a,dVar6,dVar7,(double)(~uVar5 & (ulong)dVar10 | uVar5 & (ulong)dVar1),dVar8,
                   lapl_a,lapl_b,dVar9,dVar11,eps,(double *)(lVar3 + (long)vrho),
                   (double *)((long)vrho + lVar3 + 8),(double *)(lVar4 + (long)vsigma),
                   (double *)((long)vsigma + lVar4 + 8),(double *)((long)vsigma + lVar4 + 0x10),
                   &local_58,&local_60,(double *)((long)vtau + lVar3),
                   (double *)((long)vtau + lVar3 + 8));
        lapl = local_40;
        rho = local_48;
        lVar2 = local_50;
        tau = local_38;
      }
      *(double *)((long)vlapl + lVar3) = local_58;
      *(double *)((long)vlapl + lVar3 + 8) = local_60;
      lVar4 = lVar4 + 0x18;
      lVar3 = lVar3 + 0x10;
      eps = eps + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}